

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O2

bool __thiscall
xray_re::xr_mesh_builder::b_face::is_back
          (b_face *this,b_face *face,
          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *normals,
          float normal_tolerance)

{
  pointer p_Var1;
  byte in_AL;
  bool bVar2;
  uint_fast32_t i0;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar3 = 0;
  do {
    if (lVar3 == 3) {
LAB_00163d78:
      return (bool)(lVar3 != 3 & in_AL);
    }
    if ((this->field_0).__refs[lVar3] == (face->field_0).field_0.v[0]) {
      uVar5 = 1 << ((byte)lVar3 & 0x1f) & 3;
      uVar6 = (ulong)uVar5;
      if (((((this->field_0).__refs[uVar6] == (face->field_0).field_0.v[2]) &&
           (uVar4 = (ulong)(1 << (sbyte)uVar5 & 3),
           (this->field_0).__refs[uVar4] == (face->field_0).field_0.v[1])) &&
          (this->sector == face->sector)) &&
         (((this->field_1 == face->field_1 &&
           (*(uint32_t *)((long)&this->field_0 + lVar3 * 4 + 0x18) == (face->field_0).field_0.tc[0])
           ) && ((*(uint32_t *)((long)&this->field_0 + uVar6 * 4 + 0x18) ==
                  (face->field_0).field_0.tc[2] &&
                 (*(uint32_t *)((long)&this->field_0 + uVar4 * 4 + 0x18) ==
                  (face->field_0).field_0.tc[1])))))) {
        p_Var1 = (normals->
                 super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar2 = _vector3<float>::inverted
                          (p_Var1 + *(uint *)((long)&this->field_0 + lVar3 * 4 + 0xc),
                           p_Var1 + (face->field_0).field_0.n[0],normal_tolerance);
        if (bVar2) {
          p_Var1 = (normals->
                   super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          bVar2 = _vector3<float>::inverted
                            (p_Var1 + *(uint *)((long)&this->field_0 + uVar6 * 4 + 0xc),
                             p_Var1 + (face->field_0).field_0.n[2],normal_tolerance);
          if (bVar2) {
            p_Var1 = (normals->
                     super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            in_AL = _vector3<float>::inverted
                              (p_Var1 + *(uint *)((long)&this->field_0 + uVar4 * 4 + 0xc),
                               p_Var1 + (face->field_0).field_0.n[1],normal_tolerance);
            goto LAB_00163d78;
          }
        }
      }
      in_AL = 0;
      goto LAB_00163d78;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

bool xr_mesh_builder::b_face::is_back(const b_face& face,
		const std::vector<fvector3>& normals, float normal_tolerance) const
{
	for (uint_fast32_t i0 = 0; i0 != 3; ++i0) {
		if (v[i0] != face.v0)
			continue;
		uint_fast32_t i1 = (1 << i0) & 3;
		uint_fast32_t i2 = (1 << i1) & 3;
		return v[i1] == face.v2 && v[i2] == face.v1 &&
				sector == face.sector && surface == face.surface &&
				tc[i0] == face.tc0 && tc[i1] == face.tc2 && tc[i2] == face.tc1 &&
				normals[n[i0]].inverted(normals[face.n0], normal_tolerance) &&
				normals[n[i1]].inverted(normals[face.n2], normal_tolerance) &&
				normals[n[i2]].inverted(normals[face.n1], normal_tolerance);
	}
	return false;
}